

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::APFloat::convert(APFloat *this,fltSemantics *ToSemantics,roundingMode RM,bool *losesInfo)

{
  Storage *this_00;
  IEEEFloat *this_01;
  Storage *RHS;
  opStatus oVar1;
  IEEEFloat *rhs;
  APFloat local_70;
  undefined1 local_50 [40];
  
  if ((this->U).semantics == ToSemantics) {
    *losesInfo = false;
    oVar1 = opOK;
  }
  else {
    this_00 = &this->U;
    if ((this->U).semantics == (fltSemantics *)semPPCDoubleDouble) {
      if (ToSemantics == (fltSemantics *)semPPCDoubleDouble) {
        llvm_unreachable_internal
                  ("Unexpected semantics",
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                   ,0x1175);
      }
      oVar1 = detail::IEEEFloat::convert
                        ((IEEEFloat *)((this->U).IEEE.significand.part + 8),ToSemantics,RM,losesInfo
                        );
      rhs = (IEEEFloat *)((this->U).IEEE.significand.part + 8);
      if ((this->U).semantics != (fltSemantics *)semPPCDoubleDouble) {
        rhs = (IEEEFloat *)this_00;
      }
      this_01 = (IEEEFloat *)(local_50 + 0x10);
      detail::IEEEFloat::IEEEFloat(this_01,rhs);
      APFloat(&local_70,this_01,ToSemantics);
      Storage::operator=((Storage *)&this_00->IEEE,&local_70.U);
      Storage::~Storage((Storage *)&local_70.U.IEEE);
      detail::IEEEFloat::~IEEEFloat(this_01);
    }
    else {
      if (ToSemantics != (fltSemantics *)semPPCDoubleDouble) {
        oVar1 = detail::IEEEFloat::convert(&this_00->IEEE,ToSemantics,RM,losesInfo);
        return oVar1;
      }
      oVar1 = detail::IEEEFloat::convert
                        (&this_00->IEEE,(fltSemantics *)semPPCDoubleDoubleLegacy,RM,losesInfo);
      detail::IEEEFloat::bitcastToAPInt((IEEEFloat *)local_50);
      RHS = &local_70.U;
      detail::DoubleAPFloat::DoubleAPFloat
                ((DoubleAPFloat *)&RHS->IEEE,(fltSemantics *)semPPCDoubleDouble,(APInt *)local_50);
      Storage::operator=((Storage *)&this_00->IEEE,RHS);
      Storage::~Storage((Storage *)&RHS->IEEE);
      APInt::~APInt((APInt *)local_50);
    }
  }
  return oVar1;
}

Assistant:

unsigned int IEEEFloat::significandMSB() const {
  return APInt::tcMSB(significandParts(), partCount());
}